

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O3

void __thiscall
gmath::EstimatedPlane::EstimatedPlane(EstimatedPlane *this,Vector3d *p0,Vector3d *p1,Vector3d *p2)

{
  int i;
  long lVar1;
  double ret_3;
  double dVar2;
  Vector3d N;
  Vector3d v;
  Vector3d u;
  
  this->n = 0;
  this->sx = 0.0;
  this->sy = 0.0;
  this->sz = 0.0;
  this->sxx = 0.0;
  this->sxy = 0.0;
  this->sxz = 0.0;
  this->syy = 0.0;
  this->syz = 0.0;
  this->c = INFINITY;
  this->a = INFINITY;
  this->b = INFINITY;
  u.v[0] = 0.0;
  u.v[1] = 0.0;
  u.v[2] = 0.0;
  lVar1 = 0;
  do {
    u.v[lVar1] = p1->v[lVar1] - p0->v[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  v.v[0] = 0.0;
  v.v[1] = 0.0;
  v.v[2] = 0.0;
  lVar1 = 0;
  do {
    v.v[lVar1] = p2->v[lVar1] - p0->v[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  N.v[0] = v.v[2] * u.v[1] - u.v[2] * v.v[1];
  N.v[1] = v.v[0] * u.v[2] - u.v[0] * v.v[2];
  dVar2 = u.v[0] * v.v[1] - v.v[0] * u.v[1];
  N.v[2] = dVar2;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    lVar1 = 0;
    do {
      N.v[lVar1] = N.v[lVar1] / dVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    this->a = -N.v[0];
    this->b = -N.v[1];
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + p0->v[lVar1] * N.v[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    this->c = dVar2;
  }
  return;
}

Assistant:

EstimatedPlane::EstimatedPlane(const Vector3d &p0, const Vector3d &p1, const Vector3d &p2)
{
  sx=sy=sz=0;
  sxx=sxy=sxz=syy=syz=0;
  n=0;

  a=b=c=std::numeric_limits<double>::infinity();

  Vector3d u=p1-p0;
  Vector3d v=p2-p0;
  Vector3d N=gmath::cross(u, v);

  if (fabs(N[2]) != 0)
  {
    N/=N[2];
    a=-N[0];
    b=-N[1];
    c=p0*N;
  }
}